

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int CBB_add_asn1_bool(CBB *cbb,int value)

{
  uint8_t value_00;
  int iVar1;
  undefined1 local_50 [8];
  CBB child;
  int value_local;
  CBB *cbb_local;
  
  child.u._28_4_ = value;
  iVar1 = CBB_add_asn1(cbb,(CBB *)local_50,1);
  if (iVar1 != 0) {
    value_00 = '\0';
    if (child.u._28_4_ != 0) {
      value_00 = 0xff;
    }
    iVar1 = CBB_add_u8((CBB *)local_50,value_00);
    if ((iVar1 != 0) && (iVar1 = CBB_flush(cbb), iVar1 != 0)) {
      return 1;
    }
  }
  cbb_on_error(cbb);
  return 0;
}

Assistant:

int CBB_add_asn1_bool(CBB *cbb, int value) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_BOOLEAN) ||
      !CBB_add_u8(&child, value != 0 ? 0xff : 0) || !CBB_flush(cbb)) {
    cbb_on_error(cbb);
    return 0;
  }

  return 1;
}